

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O1

void __thiscall Diligent::RenderDeviceGLImpl::FlagSupportedTexFormats(RenderDeviceGLImpl *this)

{
  BIND_FLAGS BVar1;
  BIND_FLAGS BVar2;
  TEXTURE_FORMAT TexFormat;
  RENDER_DEVICE_TYPE RVar3;
  pointer pvVar4;
  BIND_FLAGS BVar5;
  bool bVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  GLenum GVar13;
  int iVar14;
  TextureFormatAttribs *pTVar15;
  BIND_FLAGS BVar16;
  BIND_FLAGS BVar17;
  BIND_FLAGS BVar18;
  BIND_FLAGS BVar19;
  BIND_FLAGS BVar20;
  pointer ppcVar21;
  uint uVar22;
  BIND_FLAGS BVar23;
  pointer pvVar24;
  bool bVar25;
  byte bVar26;
  initializer_list<const_char_*> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<const_char_*> __l_02;
  initializer_list<const_char_*> __l_03;
  NativePixelAttribs NVar27;
  undefined1 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff09;
  string msg;
  BIND_FLAGS local_d0;
  GLint params;
  GLTextureCreateReleaseHelper local_c8;
  void *local_c0;
  BIND_FLAGS local_b8;
  GLenum err;
  int TestTextureDim;
  RENDER_DEVICE_TYPE local_ac;
  vector<const_char_*,_std::allocator<const_char_*>_> local_a8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_90;
  vector<const_char_*,_std::allocator<const_char_*>_> local_78;
  vector<const_char_*,_std::allocator<const_char_*>_> local_60;
  vector<const_char_*,_std::allocator<const_char_*>_> local_48;
  
  RVar3 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  bVar25 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
           Major < 3;
  bVar6 = CheckExtension(this,"GL_EXT_texture_compression_rgtc");
  uVar8 = true;
  uVar7 = true;
  if (!bVar6) {
    uVar7 = CheckExtension(this,"GL_ARB_texture_compression_rgtc");
  }
  bVar6 = CheckExtension(this,"GL_EXT_texture_compression_bptc");
  if (!bVar6) {
    uVar8 = CheckExtension(this,"GL_ARB_texture_compression_bptc");
  }
  bVar6 = CheckExtension(this,"GL_EXT_texture_compression_s3tc");
  uVar10 = true;
  uVar9 = true;
  if (!bVar6) {
    uVar9 = CheckExtension(this,"GL_WEBGL_compressed_texture_s3tc");
  }
  if (RVar3 != RENDER_DEVICE_TYPE_GL) {
    uVar10 = CheckExtension(this,"GL_EXT_texture_norm16");
  }
  uVar12 = true;
  uVar11 = true;
  if (RVar3 != RENDER_DEVICE_TYPE_GL && (RVar3 != RENDER_DEVICE_TYPE_GLES || bVar25)) {
    uVar11 = CheckExtension(this,"GL_ARB_texture_swizzle");
  }
  local_ac = RVar3;
  if (RVar3 != RENDER_DEVICE_TYPE_GLES || bVar25) {
    uVar12 = CheckExtension(this,"GL_ARB_ES3_compatibility");
  }
  bVar26 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Features.
           PixelUAVWritesAndAtomics != DEVICE_FEATURE_STATE_DISABLED;
  msg._M_dataplus._M_p = "GL_EXT_render_snorm";
  __l._M_len = 1;
  __l._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_48,__l,(allocator_type *)&params);
  RVar3 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar3 == RENDER_DEVICE_TYPE_GLES) {
    if (((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
         != 0xffffffff) ||
       (local_b8 = BIND_RENDER_TARGET,
       (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Minor !=
       0xffffffff)) goto LAB_002e5bff;
  }
  else {
    if (RVar3 == RENDER_DEVICE_TYPE_GL) {
      uVar22 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
               Major;
      if (uVar22 == 4) {
        uVar22 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                 APIVersion.Minor;
      }
      local_b8 = BIND_RENDER_TARGET;
      if (3 < uVar22) goto LAB_002e5c3a;
    }
LAB_002e5bff:
    local_b8 = BIND_NONE;
    for (ppcVar21 = local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start;
        ppcVar21 !=
        local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar21 = ppcVar21 + 1) {
      bVar6 = CheckExtension(this,*ppcVar21);
      if (bVar6) {
        local_b8 = BIND_RENDER_TARGET;
        break;
      }
    }
  }
LAB_002e5c3a:
  if (local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  msg._M_dataplus._M_p = "GL_EXT_texture_norm16";
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_60,__l_00,(allocator_type *)&params);
  RVar3 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  ppcVar21 = local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (RVar3 == RENDER_DEVICE_TYPE_GLES) {
    if (((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
         != 0xffffffff) ||
       (BVar16 = BIND_RENDER_TARGET,
       (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Minor !=
       0xffffffff)) goto LAB_002e5cc7;
  }
  else if ((RVar3 != RENDER_DEVICE_TYPE_GL) ||
          (BVar16 = BIND_RENDER_TARGET,
          (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
          < 4)) {
LAB_002e5cc7:
    for (; ppcVar21 !=
           local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish; ppcVar21 = ppcVar21 + 1) {
      bVar6 = CheckExtension(this,*ppcVar21);
      if (bVar6) {
        BVar16 = BIND_RENDER_TARGET;
        goto LAB_002e5ceb;
      }
    }
    BVar16 = BIND_NONE;
  }
LAB_002e5ceb:
  if (local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  msg._M_dataplus._M_p = "GL_EXT_render_snorm";
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_78,__l_01,(allocator_type *)&params);
  RVar3 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar3 == RENDER_DEVICE_TYPE_GLES) {
    if (((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
         != 0xffffffff) ||
       (local_d0 = BIND_RENDER_TARGET,
       (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Minor !=
       0xffffffff)) goto LAB_002e5d74;
  }
  else {
    if (RVar3 == RENDER_DEVICE_TYPE_GL) {
      uVar22 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
               Major;
      if (uVar22 == 4) {
        uVar22 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                 APIVersion.Minor;
      }
      local_d0 = BIND_RENDER_TARGET;
      if (3 < uVar22) goto LAB_002e5daf;
    }
LAB_002e5d74:
    local_d0 = BIND_NONE;
    for (ppcVar21 = local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start;
        ppcVar21 !=
        local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar21 = ppcVar21 + 1) {
      bVar6 = CheckExtension(this,*ppcVar21);
      if (bVar6) {
        local_d0 = BIND_RENDER_TARGET;
        break;
      }
    }
  }
LAB_002e5daf:
  if (local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  msg._M_dataplus._M_p = "GL_EXT_color_buffer_half_float";
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_90,__l_02,(allocator_type *)&params);
  RVar3 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar3 == RENDER_DEVICE_TYPE_GLES) {
    uVar22 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
             Major;
    bVar6 = 2 < uVar22;
    if (uVar22 == 3) {
      bVar6 = 1 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor;
    }
    local_c0 = (void *)CONCAT44(local_c0._4_4_,0x20);
    if (!bVar6) goto LAB_002e5e3c;
  }
  else if ((RVar3 != RENDER_DEVICE_TYPE_GL) ||
          (local_c0 = (void *)CONCAT44(local_c0._4_4_,0x20),
          (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
          < 4)) {
LAB_002e5e3c:
    local_c0 = (void *)((ulong)local_c0 & 0xffffffff00000000);
    for (ppcVar21 = local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start;
        ppcVar21 !=
        local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar21 = ppcVar21 + 1) {
      bVar6 = CheckExtension(this,*ppcVar21);
      if (bVar6) {
        local_c0 = (void *)CONCAT44(local_c0._4_4_,0x20);
        break;
      }
    }
  }
  if (local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  msg._M_dataplus._M_p = "GL_EXT_color_buffer_float";
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)&msg;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_a8,__l_03,(allocator_type *)&params);
  RVar3 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar3 == RENDER_DEVICE_TYPE_GLES) {
    uVar22 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
             Major;
    bVar6 = 2 < uVar22;
    if (uVar22 == 3) {
      bVar6 = 1 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor;
    }
    BVar20 = BIND_RENDER_TARGET;
    if (!bVar6) goto LAB_002e5ef4;
  }
  else if ((RVar3 != RENDER_DEVICE_TYPE_GL) ||
          (BVar20 = BIND_RENDER_TARGET,
          (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.Major
          < 4)) {
LAB_002e5ef4:
    BVar20 = BIND_NONE;
    for (ppcVar21 = local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start; in_stack_ffffffffffffff09 = uVar10,
        ppcVar21 !=
        local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar21 = ppcVar21 + 1) {
      bVar6 = CheckExtension(this,*ppcVar21);
      if (bVar6) {
        BVar20 = BIND_RENDER_TARGET;
        in_stack_ffffffffffffff09 = uVar10;
        break;
      }
    }
  }
  uVar22 = (uint)bVar26;
  BVar1 = uVar22 * 0x80 + BIND_SHADER_RESOURCE;
  if (local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  BVar23 = uVar22 * 0x80 | (BIND_RENDER_TARGET|BIND_SHADER_RESOURCE);
  BVar19 = local_b8 | BVar1;
  BVar2 = (BIND_FLAGS)local_c0 | BVar1;
  local_c0 = (void *)CONCAT44(local_c0._4_4_,BVar2);
  BVar20 = BVar20 | BVar1;
  RVar3 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar3 == RENDER_DEVICE_TYPE_GLES) {
    uVar22 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
             Major;
    bVar6 = 2 < uVar22;
    if (uVar22 == 3) {
      bVar6 = 1 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor;
    }
    BVar18 = BIND_RENDER_TARGET;
    if (bVar6) goto LAB_002e5fbf;
  }
  else if ((RVar3 == RENDER_DEVICE_TYPE_GL) &&
          (BVar18 = BIND_RENDER_TARGET,
          3 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
              Major)) goto LAB_002e5fbf;
  BVar18 = BIND_NONE;
LAB_002e5fbf:
  BVar17 = BIND_NONE;
  BVar5 = local_d0 | BVar1;
  BVar16 = BVar16 | BVar1;
  if ((Bool)uVar10 == false) {
    BVar5 = BVar17;
    BVar16 = BVar17;
  }
  bVar6 = local_ac == RENDER_DEVICE_TYPE_GL;
  pvVar24 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar24[1].super_TextureFormatInfo.Supported = true;
  pvVar24[1].BindFlags = BIND_NONE;
  pvVar24[1].Filterable = false;
  pvVar24[2].super_TextureFormatInfo.Supported = true;
  pvVar24[2].BindFlags = BVar20;
  pvVar24[2].Filterable = bVar6;
  pvVar24[3].super_TextureFormatInfo.Supported = true;
  pvVar24[3].BindFlags = BVar23;
  pvVar24[3].Filterable = false;
  pvVar24[4].super_TextureFormatInfo.Supported = true;
  pvVar24[4].BindFlags = BVar23;
  pvVar24[4].Filterable = false;
  pvVar24[5].super_TextureFormatInfo.Supported = true;
  pvVar24[5].BindFlags = BIND_NONE;
  pvVar24[5].Filterable = false;
  pvVar24[6].super_TextureFormatInfo.Supported = true;
  pvVar24[6].BindFlags = BVar20;
  pvVar24[6].Filterable = bVar6;
  pvVar24[8].super_TextureFormatInfo.Supported = true;
  pvVar24[8].BindFlags = BVar23;
  pvVar24[8].Filterable = false;
  pvVar24[7].super_TextureFormatInfo.Supported = true;
  pvVar24[7].BindFlags = BVar23;
  pvVar24[7].Filterable = false;
  pvVar24[9].super_TextureFormatInfo.Supported = true;
  pvVar24[9].BindFlags = BIND_NONE;
  pvVar24[9].Filterable = false;
  pvVar24[10].super_TextureFormatInfo.Supported = true;
  pvVar24[10].BindFlags = BVar2;
  pvVar24[10].Filterable = true;
  pvVar24[0xb].super_TextureFormatInfo.Supported = (Bool)uVar10;
  pvVar24[0xb].BindFlags = BVar16;
  pvVar24[0xb].Filterable = (Bool)uVar10;
  pvVar24[0xc].super_TextureFormatInfo.Supported = true;
  pvVar24[0xc].BindFlags = BVar23;
  pvVar24[0xc].Filterable = false;
  pvVar24[0xd].super_TextureFormatInfo.Supported = (Bool)uVar10;
  pvVar24[0xd].BindFlags = BVar5;
  pvVar24[0xd].Filterable = (Bool)uVar10;
  pvVar24[0xe].super_TextureFormatInfo.Supported = true;
  pvVar24[0xe].BindFlags = BVar23;
  pvVar24[0xe].Filterable = false;
  pvVar24[0xf].super_TextureFormatInfo.Supported = true;
  pvVar24[0xf].BindFlags = BIND_NONE;
  pvVar24[0xf].Filterable = false;
  pvVar24[0x10].super_TextureFormatInfo.Supported = true;
  pvVar24[0x10].BindFlags = BVar20;
  pvVar24[0x10].Filterable = bVar6;
  pvVar24[0x12].super_TextureFormatInfo.Supported = true;
  pvVar24[0x12].BindFlags = BVar23;
  pvVar24[0x12].Filterable = false;
  pvVar24[0x11].super_TextureFormatInfo.Supported = true;
  pvVar24[0x11].BindFlags = BVar23;
  pvVar24[0x11].Filterable = false;
  pvVar24[0x13].super_TextureFormatInfo.Supported = true;
  pvVar24[0x13].BindFlags = BIND_NONE;
  pvVar24[0x13].Filterable = false;
  pvVar24[0x14].super_TextureFormatInfo.Supported = true;
  pvVar24[0x14].BindFlags = BIND_DEPTH_STENCIL;
  pvVar24[0x14].Filterable = false;
  pvVar24[0x15].super_TextureFormatInfo.Supported = true;
  pvVar24[0x15].BindFlags = BVar1;
  pvVar24[0x15].Filterable = bVar6;
  pvVar24[0x16].super_TextureFormatInfo.Supported = false;
  pvVar24[0x16].BindFlags = BIND_NONE;
  pvVar24[0x16].Filterable = false;
  pvVar24[0x17].super_TextureFormatInfo.Supported = true;
  pvVar24[0x17].BindFlags = BIND_NONE;
  pvVar24[0x17].Filterable = false;
  pvVar24[0x18].super_TextureFormatInfo.Supported = true;
  pvVar24[0x18].BindFlags = BVar23;
  pvVar24[0x18].Filterable = true;
  pvVar24[0x19].super_TextureFormatInfo.Supported = true;
  pvVar24[0x19].BindFlags = BVar23;
  pvVar24[0x19].Filterable = false;
  pvVar24[0x1a].super_TextureFormatInfo.Supported = true;
  pvVar24[0x1a].BindFlags = BVar18 | BVar1;
  pvVar24[0x1a].Filterable = true;
  pvVar24[0x1b].super_TextureFormatInfo.Supported = true;
  pvVar24[0x1b].BindFlags = BIND_NONE;
  pvVar24[0x1b].Filterable = false;
  pvVar24[0x1c].super_TextureFormatInfo.Supported = true;
  pvVar24[0x1c].BindFlags = BVar23;
  pvVar24[0x1c].Filterable = true;
  pvVar24[0x1d].super_TextureFormatInfo.Supported = true;
  pvVar24[0x1d].BindFlags = BVar23;
  pvVar24[0x1d].Filterable = true;
  pvVar24[0x1e].super_TextureFormatInfo.Supported = true;
  pvVar24[0x1e].BindFlags = BVar23;
  pvVar24[0x1e].Filterable = false;
  pvVar24[0x1f].super_TextureFormatInfo.Supported = true;
  pvVar24[0x1f].BindFlags = BVar19;
  pvVar24[0x1f].Filterable = true;
  pvVar24[0x20].super_TextureFormatInfo.Supported = true;
  pvVar24[0x20].BindFlags = BVar23;
  pvVar24[0x20].Filterable = false;
  pvVar24[0x21].super_TextureFormatInfo.Supported = true;
  pvVar24[0x21].BindFlags = BIND_NONE;
  pvVar24[0x21].Filterable = false;
  pvVar24[0x22].super_TextureFormatInfo.Supported = true;
  pvVar24[0x22].BindFlags = BVar2;
  pvVar24[0x22].Filterable = true;
  pvVar24 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar24[0x23].super_TextureFormatInfo.Supported = (Bool)uVar10;
  pvVar24[0x23].BindFlags = BVar16;
  pvVar24[0x23].Filterable = (Bool)uVar10;
  pvVar24[0x24].super_TextureFormatInfo.Supported = true;
  pvVar24[0x24].BindFlags = BVar23;
  pvVar24[0x24].Filterable = false;
  pvVar24[0x25].super_TextureFormatInfo.Supported = (Bool)uVar10;
  pvVar24[0x25].BindFlags = BVar5;
  pvVar24[0x25].Filterable = (Bool)uVar10;
  pvVar24[0x26].super_TextureFormatInfo.Supported = true;
  pvVar24[0x26].BindFlags = BVar23;
  pvVar24[0x26].Filterable = false;
  pvVar24[0x27].super_TextureFormatInfo.Supported = true;
  pvVar24[0x27].BindFlags = BIND_NONE;
  pvVar24[0x27].Filterable = false;
  pvVar24[0x28].super_TextureFormatInfo.Supported = true;
  pvVar24[0x28].BindFlags = BIND_DEPTH_STENCIL;
  pvVar24[0x28].Filterable = false;
  pvVar24[0x29].super_TextureFormatInfo.Supported = true;
  pvVar24[0x29].BindFlags = BVar20;
  pvVar24[0x29].Filterable = bVar6;
  pvVar24[0x2a].super_TextureFormatInfo.Supported = true;
  pvVar24[0x2a].BindFlags = BVar23;
  pvVar24[0x2a].Filterable = false;
  pvVar24[0x2b].super_TextureFormatInfo.Supported = true;
  pvVar24[0x2b].BindFlags = BVar23;
  pvVar24[0x2b].Filterable = false;
  pvVar24[0x2c].super_TextureFormatInfo.Supported = true;
  pvVar24[0x2c].BindFlags = BIND_NONE;
  pvVar24[0x2c].Filterable = false;
  pvVar24[0x2d].super_TextureFormatInfo.Supported = true;
  pvVar24[0x2d].BindFlags = BIND_DEPTH_STENCIL;
  pvVar24[0x2d].Filterable = false;
  pvVar24[0x2e].super_TextureFormatInfo.Supported = true;
  pvVar24[0x2e].BindFlags = BVar1;
  pvVar24[0x2e].Filterable = true;
  pvVar24[0x2f].super_TextureFormatInfo.Supported = false;
  pvVar24[0x2f].BindFlags = BIND_NONE;
  pvVar24[0x2f].Filterable = false;
  pvVar24[0x30].super_TextureFormatInfo.Supported = true;
  pvVar24[0x30].BindFlags = BIND_NONE;
  pvVar24[0x30].Filterable = false;
  pvVar24[0x31].super_TextureFormatInfo.Supported = true;
  pvVar24[0x31].BindFlags = BVar23;
  pvVar24[0x31].Filterable = true;
  pvVar24[0x32].super_TextureFormatInfo.Supported = true;
  pvVar24[0x32].BindFlags = BVar23;
  pvVar24[0x32].Filterable = false;
  pvVar24[0x33].super_TextureFormatInfo.Supported = true;
  pvVar24[0x33].BindFlags = BVar19;
  pvVar24[0x33].Filterable = true;
  pvVar24[0x34].super_TextureFormatInfo.Supported = true;
  pvVar24[0x34].BindFlags = BVar23;
  pvVar24[0x34].Filterable = false;
  pvVar24[0x35].super_TextureFormatInfo.Supported = true;
  pvVar24[0x35].BindFlags = BIND_NONE;
  pvVar24[0x35].Filterable = false;
  pvVar24[0x36].super_TextureFormatInfo.Supported = true;
  pvVar24[0x36].BindFlags = BVar2;
  pvVar24[0x36].Filterable = true;
  pvVar24[0x37].super_TextureFormatInfo.Supported = true;
  pvVar24[0x37].BindFlags = BIND_DEPTH_STENCIL;
  pvVar24[0x37].Filterable = false;
  pvVar24[0x38].super_TextureFormatInfo.Supported = (Bool)uVar10;
  pvVar24[0x38].BindFlags = BVar16;
  pvVar24[0x38].Filterable = (Bool)uVar10;
  pvVar24[0x39].super_TextureFormatInfo.Supported = true;
  pvVar24[0x39].BindFlags = BVar23;
  pvVar24[0x39].Filterable = false;
  pvVar24[0x3a].super_TextureFormatInfo.Supported = (Bool)uVar10;
  pvVar24[0x3a].BindFlags = BVar5;
  pvVar24[0x3a].Filterable = (Bool)uVar10;
  pvVar24[0x3b].super_TextureFormatInfo.Supported = true;
  pvVar24[0x3b].BindFlags = BVar23;
  pvVar24[0x3b].Filterable = false;
  pvVar24[0x3c].super_TextureFormatInfo.Supported = true;
  pvVar24[0x3c].BindFlags = BIND_NONE;
  pvVar24[0x3c].Filterable = false;
  pvVar24[0x3d].super_TextureFormatInfo.Supported = true;
  pvVar24[0x3d].BindFlags = BVar23;
  pvVar24[0x3d].Filterable = true;
  pvVar24[0x3e].super_TextureFormatInfo.Supported = true;
  pvVar24[0x3e].BindFlags = BVar23;
  pvVar24[0x3e].Filterable = false;
  pvVar24[0x3f].super_TextureFormatInfo.Supported = true;
  pvVar24[0x3f].BindFlags = BVar19;
  pvVar24[0x3f].Filterable = true;
  pvVar24[0x40].super_TextureFormatInfo.Supported = true;
  pvVar24[0x40].BindFlags = BVar23;
  pvVar24[0x40].Filterable = false;
  pvVar24[0x41].super_TextureFormatInfo.Supported = (Bool)uVar11;
  if ((Bool)uVar11 == false) {
    BVar23 = BVar17;
  }
  pvVar24[0x41].BindFlags = BVar23;
  pvVar24[0x41].Filterable = (Bool)uVar11;
  pvVar24[0x42].super_TextureFormatInfo.Supported = false;
  pvVar24[0x42].BindFlags = BIND_NONE;
  pvVar24[0x42].Filterable = false;
  pvVar24[0x43].super_TextureFormatInfo.Supported = true;
  pvVar24[0x43].BindFlags = BIND_SHADER_RESOURCE;
  pvVar24[0x43].Filterable = true;
  pvVar24[0x44].super_TextureFormatInfo.Supported = false;
  pvVar24[0x44].BindFlags = BIND_NONE;
  pvVar24[0x44].Filterable = false;
  pvVar24 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar24[0x45].super_TextureFormatInfo.Supported = false;
  pvVar24[0x45].BindFlags = BIND_NONE;
  pvVar24[0x45].Filterable = false;
  pvVar24[0x46].super_TextureFormatInfo.Supported = (Bool)uVar9;
  pvVar24[0x46].BindFlags = BIND_NONE;
  pvVar24[0x46].Filterable = false;
  pvVar24[0x47].super_TextureFormatInfo.Supported = (Bool)uVar9;
  BVar16 = (uint)(byte)uVar9 * 8;
  pvVar24[0x47].BindFlags = BVar16;
  pvVar24[0x47].Filterable = (Bool)uVar9;
  pvVar24[0x48].super_TextureFormatInfo.Supported = (Bool)uVar9;
  pvVar24[0x48].BindFlags = BVar16;
  pvVar24[0x48].Filterable = (Bool)uVar9;
  pvVar24[0x49].super_TextureFormatInfo.Supported = (Bool)uVar9;
  pvVar24[0x49].BindFlags = BIND_NONE;
  pvVar24[0x49].Filterable = false;
  pvVar24[0x4a].super_TextureFormatInfo.Supported = (Bool)uVar9;
  pvVar24[0x4a].BindFlags = BVar16;
  pvVar24[0x4a].Filterable = (Bool)uVar9;
  pvVar24[0x4b].super_TextureFormatInfo.Supported = (Bool)uVar9;
  pvVar24[0x4b].BindFlags = BVar16;
  pvVar24[0x4b].Filterable = (Bool)uVar9;
  pvVar24[0x4c].super_TextureFormatInfo.Supported = (Bool)uVar9;
  pvVar24[0x4c].BindFlags = BIND_NONE;
  pvVar24[0x4c].Filterable = false;
  pvVar24[0x4d].super_TextureFormatInfo.Supported = (Bool)uVar9;
  pvVar24[0x4d].BindFlags = BVar16;
  pvVar24[0x4d].Filterable = (Bool)uVar9;
  pvVar24[0x4e].super_TextureFormatInfo.Supported = (Bool)uVar9;
  pvVar24[0x4e].BindFlags = BVar16;
  pvVar24[0x4e].Filterable = (Bool)uVar9;
  pvVar24[0x4f].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar24[0x4f].BindFlags = BIND_NONE;
  pvVar24[0x4f].Filterable = false;
  pvVar24[0x50].super_TextureFormatInfo.Supported = (Bool)uVar7;
  BVar16 = (uint)(byte)uVar7 * 8;
  pvVar24[0x50].BindFlags = BVar16;
  pvVar24[0x50].Filterable = (Bool)uVar7;
  pvVar24[0x51].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar24[0x51].BindFlags = BVar16;
  pvVar24[0x51].Filterable = (Bool)uVar7;
  pvVar24[0x52].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar24[0x52].BindFlags = BIND_NONE;
  pvVar24[0x52].Filterable = false;
  pvVar24[0x53].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar24[0x53].BindFlags = BVar16;
  pvVar24[0x53].Filterable = (Bool)uVar7;
  pvVar24[0x54].super_TextureFormatInfo.Supported = (Bool)uVar7;
  pvVar24[0x54].BindFlags = BVar16;
  pvVar24[0x54].Filterable = (Bool)uVar7;
  pvVar24[0x55].super_TextureFormatInfo.Supported = false;
  pvVar24[0x55].BindFlags = BIND_NONE;
  pvVar24[0x55].Filterable = false;
  pvVar24[0x56].super_TextureFormatInfo.Supported = false;
  pvVar24[0x56].BindFlags = BIND_NONE;
  pvVar24[0x56].Filterable = false;
  pvVar24[0x57].super_TextureFormatInfo.Supported = (Bool)uVar11;
  pvVar24[0x57].BindFlags = (uint)(byte)uVar11 * 8;
  pvVar24[0x57].Filterable = (Bool)uVar11;
  pvVar24[0x58].super_TextureFormatInfo.Supported = false;
  pvVar24[0x58].BindFlags = BIND_NONE;
  pvVar24[0x58].Filterable = false;
  pvVar24[0x59].super_TextureFormatInfo.Supported = false;
  pvVar24[0x59].BindFlags = BIND_NONE;
  pvVar24[0x59].Filterable = false;
  pvVar24[0x5a].super_TextureFormatInfo.Supported = false;
  pvVar24[0x5a].BindFlags = BIND_NONE;
  pvVar24[0x5a].Filterable = false;
  pvVar24[0x5b].super_TextureFormatInfo.Supported = false;
  pvVar24[0x5b].BindFlags = BIND_NONE;
  pvVar24[0x5b].Filterable = false;
  pvVar24[0x5c].super_TextureFormatInfo.Supported = false;
  pvVar24[0x5c].BindFlags = BIND_NONE;
  pvVar24[0x5c].Filterable = false;
  pvVar24[0x5d].super_TextureFormatInfo.Supported = false;
  pvVar24[0x5d].BindFlags = BIND_NONE;
  pvVar24[0x5d].Filterable = false;
  pvVar24[0x5e].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar24[0x5e].BindFlags = BIND_NONE;
  pvVar24[0x5e].Filterable = false;
  pvVar24[0x5f].super_TextureFormatInfo.Supported = (Bool)uVar8;
  BVar16 = (uint)(byte)uVar8 * 8;
  pvVar24[0x5f].BindFlags = BVar16;
  pvVar24[0x5f].Filterable = (Bool)uVar8;
  pvVar24[0x60].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar24[0x60].BindFlags = BVar16;
  pvVar24[0x60].Filterable = (Bool)uVar8;
  pvVar24[0x61].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar24[0x61].BindFlags = BIND_NONE;
  pvVar24[0x61].Filterable = false;
  pvVar24[0x62].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar24[0x62].BindFlags = BVar16;
  pvVar24[0x62].Filterable = (Bool)uVar8;
  pvVar24[99].super_TextureFormatInfo.Supported = (Bool)uVar8;
  pvVar24[99].BindFlags = BVar16;
  pvVar24[99].Filterable = (Bool)uVar8;
  pvVar24[100].super_TextureFormatInfo.Supported = (Bool)uVar12;
  BVar16 = (uint)(byte)uVar12 * 8;
  pvVar24[100].BindFlags = BVar16;
  pvVar24[100].Filterable = (Bool)uVar12;
  pvVar24[0x65].super_TextureFormatInfo.Supported = (Bool)uVar12;
  pvVar24[0x65].BindFlags = BVar16;
  pvVar24[0x65].Filterable = (Bool)uVar12;
  pvVar24[0x66].super_TextureFormatInfo.Supported = (Bool)uVar12;
  pvVar24[0x66].BindFlags = BVar16;
  pvVar24[0x66].Filterable = (Bool)uVar12;
  pvVar24 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar24[0x67].super_TextureFormatInfo.Supported = (Bool)uVar12;
  pvVar24[0x67].BindFlags = BVar16;
  pvVar24[0x67].Filterable = (Bool)uVar12;
  pvVar24[0x68].super_TextureFormatInfo.Supported = (Bool)uVar12;
  pvVar24[0x68].BindFlags = BVar16;
  pvVar24[0x68].Filterable = (Bool)uVar12;
  pvVar24[0x69].super_TextureFormatInfo.Supported = (Bool)uVar12;
  pvVar24[0x69].BindFlags = BVar16;
  pvVar24[0x69].Filterable = (Bool)uVar12;
  if ((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type ==
      RENDER_DEVICE_TYPE_GL) {
    uVar22 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.APIVersion.
             Major;
    BVar17 = (uint)(3 < uVar22);
    if (uVar22 == 4) {
      BVar17 = (uint)(2 < (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                          APIVersion.Minor);
    }
  }
  TestTextureDim = 8;
  local_c0 = operator_new(0x400);
  memset(local_c0,0,0x400);
  pvVar24 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
            super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_TextureFormatsInfo.
           super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pvVar24 == pvVar4) {
      operator_delete(local_c0,0x400);
      return;
    }
    TexFormat = (pvVar24->super_TextureFormatInfo).super_TextureFormatAttribs.Format;
    if (TexFormat != TEX_FORMAT_UNKNOWN) {
      GVar13 = TexFormatToGLInternalTexFormat(TexFormat,0);
      if (GVar13 == 0) {
        if ((pvVar24->super_TextureFormatInfo).Supported == true) {
          FormatString<char[39]>(&msg,(char (*) [39])"Format should be marked as unsupported");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"FlagSupportedTexFormats",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                     ,0x549);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        if ((char)BVar17 != '\0') {
          params = 0;
          (*__glewGetInternalformativ)(0xde1,GVar13,0x826f,1,&params);
          err = glGetError();
          if (err != 0) {
            LogError<false,char[31],char[17],unsigned_int>
                      (false,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x553,(char (*) [31])"glGetInternalformativ() failed",
                       (char (*) [17])"\nGL Error Code: ",&err);
            FormatString<char[6]>(&msg,(char (*) [6])0x861532);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x553);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if ((pvVar24->super_TextureFormatInfo).Supported != (params == 1)) {
            FormatString<char[41]>(&msg,(char (*) [41])"This internal format should be supported");
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x554);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((((pvVar24->super_TextureFormatInfo).Supported == true) &&
            (1 < (byte)((pvVar24->super_TextureFormatInfo).super_TextureFormatAttribs.ComponentType
                       - COMPONENT_TYPE_DEPTH))) &&
           ((pvVar24->super_TextureFormatInfo).super_TextureFormatAttribs.IsTypeless == false)) {
          GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::
          GLObjWrapper((GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *)&params,true,
                       (GLTextureCreateReleaseHelper)0x0);
          glBindTexture(0xde1,params);
          err = glGetError();
          if (err != 0) {
            LogError<false,char[23],char[17],unsigned_int>
                      (false,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x560,(char (*) [23])"Failed to bind texture",
                       (char (*) [17])"\nGL Error Code: ",&err);
            FormatString<char[6]>(&msg,(char (*) [6])0x861532);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"FlagSupportedTexFormats",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
                       ,0x560);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          (*__glewTexStorage2D)(0xde1,1,GVar13,8,8);
          iVar14 = glGetError();
          if (iVar14 == 0) {
            NVar27 = GetNativePixelTransferAttribs
                               ((pvVar24->super_TextureFormatInfo).super_TextureFormatAttribs.Format
                               );
            if (((undefined1  [12])NVar27 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
              glTexSubImage2D(0xde1,0,0,0,8,8,NVar27._0_8_,NVar27._0_8_ >> 0x20,local_c0);
            }
            else {
              pTVar15 = GetTextureFormatAttribs
                                  ((pvVar24->super_TextureFormatInfo).super_TextureFormatAttribs.
                                   Format);
              (*__glewCompressedTexSubImage2D)
                        (0xde1,0,0,0,8,8,GVar13,
                         (uint)(8 / pTVar15->BlockHeight) *
                         (uint)pTVar15->ComponentSize * (int)(8 / pTVar15->BlockWidth),local_c0);
            }
            iVar14 = glGetError();
            if (iVar14 != 0) {
              FormatString<char[33],int,char[2],int,char[2],char_const*,char[106]>
                        (&msg,(Diligent *)"Failed to upload data to a test ",
                         (char (*) [33])&TestTextureDim,(int *)0x92fb60,
                         (char (*) [2])&TestTextureDim,(int *)0x90e58d,(char (*) [2])pvVar24,
                         (char **)
                         " texture. This likely indicates that the format is not supported despite being reported so by the device."
                         ,(char (*) [106])
                          CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar12,CONCAT14(uVar11,CONCAT13(
                                                  uVar9,CONCAT12(bVar26,CONCAT11(
                                                  in_stack_ffffffffffffff09,
                                                  in_stack_ffffffffffffff08))))))));
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
              }
              goto LAB_002e6c5f;
            }
          }
          else {
            FormatString<char[39],int,char[2],int,char[2],char_const*,char[106]>
                      (&msg,(Diligent *)"Failed to allocate storage for a test ",
                       (char (*) [39])&TestTextureDim,(int *)0x92fb60,(char (*) [2])&TestTextureDim,
                       (int *)0x90e58d,(char (*) [2])pvVar24,
                       (char **)
                       " texture. This likely indicates that the format is not supported despite being reported so by the device."
                       ,(char (*) [106])
                        CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar12,CONCAT14(uVar11,CONCAT13(uVar9
                                                  ,CONCAT12(bVar26,CONCAT11(
                                                  in_stack_ffffffffffffff09,
                                                  in_stack_ffffffffffffff08))))))));
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
            }
LAB_002e6c5f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            (pvVar24->super_TextureFormatInfo).Supported = false;
          }
          glBindTexture(0xde1);
          if (params != 0) {
            msg._M_dataplus._M_p._0_4_ = params;
            if (local_c8.m_ExternalGLTextureHandle == 0) {
              glDeleteTextures(1);
            }
            else {
              local_c8.m_ExternalGLTextureHandle = 0;
            }
            params = 0;
          }
        }
      }
    }
    pvVar24 = pvVar24 + 1;
  } while( true );
}

Assistant:

void RenderDeviceGLImpl::FlagSupportedTexFormats()
{
    const auto& DeviceInfo     = GetDeviceInfo();
    const auto  bDekstopGL     = DeviceInfo.Type == RENDER_DEVICE_TYPE_GL;
    const auto  bGLES30OrAbove = DeviceInfo.Type == RENDER_DEVICE_TYPE_GLES && DeviceInfo.APIVersion >= Version{3, 0};

    const bool bRGTC       = CheckExtension("GL_EXT_texture_compression_rgtc") || CheckExtension("GL_ARB_texture_compression_rgtc");
    const bool bBPTC       = CheckExtension("GL_EXT_texture_compression_bptc") || CheckExtension("GL_ARB_texture_compression_bptc");
    const bool bS3TC       = CheckExtension("GL_EXT_texture_compression_s3tc") || CheckExtension("GL_WEBGL_compressed_texture_s3tc");
    const bool bTexNorm16  = bDekstopGL || CheckExtension("GL_EXT_texture_norm16"); // Only for ES3.1+
    const bool bTexSwizzle = bDekstopGL || bGLES30OrAbove || CheckExtension("GL_ARB_texture_swizzle");

#if PLATFORM_WEB
    const bool bETC2 = CheckExtension("GL_WEBGL_compressed_texture_etc");
#else
    const bool bETC2 = bGLES30OrAbove || CheckExtension("GL_ARB_ES3_compatibility");
#endif

    //              ||   GLES3.0   ||            GLES3.1              ||            GLES3.2              ||
    // |   Format   ||  CR  |  TF  ||  CR  |  TF  | Req RB | Req. Tex ||  CR  |  TF  | Req RB | Req. Tex ||
    // |------------||------|------||------|------|--------|----------||------|------|--------|----------||
    // |     U8     ||  V   |  V   ||  V   |  V   |   V    |    V     ||  V   |  V   |   V    |    V     ||
    // |     S8     ||      |  V   ||      |  V   |        |    V     ||      |  V   |        |    V     ||
    // |  SRGBA8    ||  V   |  V   ||  V   |  V   |   V    |    V     ||  V   |  V   |   V    |    V     ||
    // |    UI8     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |    SI8     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |    U16     ||  -   |  -   ||  -   |  -   |   -    |    -     ||  -   |  -   |   -    |    -     ||
    // |    S16     ||  -   |  -   ||  -   |  -   |   -    |    -     ||  -   |  -   |   -    |    -     ||
    // |   UI16     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |   SI16     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |   UI32     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |   SI32     ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // |    F16     ||      |  V   ||      |  V   |        |    V     || +V   |  V   |  +V    |    V     ||
    // |    F32     ||      |      ||      |      |        |    V     || +V   |      |  +V    |    V     ||
    // |  RGB10A2   ||  V   |  V   ||  V   |  V   |   V    |    V     ||  V   |  V   |   V    |    V     ||
    // | RGB10A2UI  ||  V   |      ||  V   |      |   V    |    V     ||  V   |      |   V    |    V     ||
    // | R11G11B10F ||      |  V   ||      |  V   |        |    V     || +V   |  V   |   V    |    V     ||
    // |  RGB9_E5   ||      |      ||      |  V   |        |    V     ||      |  V   |        |    V     ||

    // CR (Color Renderable)          - texture can be used as color attachment
    // TF (Texture Filterable)        - texture can be filtered (mipmapping and minification/magnification filtering)
    // Req RB (Required Renderbuffer) - texture supports renderbuffer usage
    // Req. Tex (Required Texture)    - texture usage is supported

    static constexpr Version NotAvaiable = Version{~0u, ~0u};

    auto CheckBindFlagSupport = [&](BIND_FLAGS                     BindFlag,
                                    const Version&                 MinGLVersion,
                                    const Version&                 MinGLESVersion = Version{~0u, ~0u},
                                    const std::vector<const char*> Extensions     = {}) {
        if (DeviceInfo.Type == RENDER_DEVICE_TYPE_GL && DeviceInfo.APIVersion >= MinGLVersion)
            return BindFlag;

        if (DeviceInfo.Type == RENDER_DEVICE_TYPE_GLES && DeviceInfo.APIVersion >= MinGLESVersion)
            return BindFlag;

        for (const auto* Ext : Extensions)
        {
            if (CheckExtension(Ext))
                return BindFlag;
        }

        return BIND_NONE;
    };

    const BIND_FLAGS TexBindFlags =
        BIND_SHADER_RESOURCE |
        (m_DeviceInfo.Features.PixelUAVWritesAndAtomics ? BIND_UNORDERED_ACCESS : BIND_NONE);

    BIND_FLAGS U8BindFlags         = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SRGBA8BindFlags     = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS S8BindFlags         = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 4}, NotAvaiable, {"GL_EXT_render_snorm"});
    BIND_FLAGS UI8BindFlags        = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SI8BindFlags        = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS U16BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, NotAvaiable, {"GL_EXT_texture_norm16"});
    BIND_FLAGS S16BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 4}, NotAvaiable, {"GL_EXT_render_snorm"});
    BIND_FLAGS UI16BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SI16BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS UI32BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS SI32BindFlags       = TexBindFlags | BIND_RENDER_TARGET;
    BIND_FLAGS F16BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, {3, 2}, {"GL_EXT_color_buffer_half_float"});
    BIND_FLAGS F32BindFlags        = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, {3, 2}, {"GL_EXT_color_buffer_float"});
    BIND_FLAGS R11G11B10FBindFlags = TexBindFlags | CheckBindFlagSupport(BIND_RENDER_TARGET, {4, 0}, {3, 2});
    BIND_FLAGS BindSrvRtvUav       = TexBindFlags | BIND_RENDER_TARGET;

    auto FlagFormat = [this](TEXTURE_FORMAT Fmt, bool Supported, BIND_FLAGS BindFlags = BIND_NONE, bool Filterable = false) {
        TextureFormatInfoExt& FmtInfo = m_TextureFormatsInfo[Fmt];

        FmtInfo.Supported  = Supported;
        FmtInfo.BindFlags  = Supported ? BindFlags : BIND_NONE;
        FmtInfo.Filterable = Supported && Filterable;
    };

    // The formats marked by true below are required in GL 3.3+ and GLES 3.0+
    // Note that GLES2.0 does not specify any required formats

    // clang-format off
    //               Format                           Supported     BindFlags       Filterable
    FlagFormat(TEX_FORMAT_RGBA32_TYPELESS,            true                                      );
    FlagFormat(TEX_FORMAT_RGBA32_FLOAT,               true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_RGBA32_UINT,                true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGBA32_SINT,                true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGB32_TYPELESS,             true                                      );
    FlagFormat(TEX_FORMAT_RGB32_FLOAT,                true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_RGB32_SINT,                 true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGB32_UINT,                 true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_RGBA16_TYPELESS,            true                                      );
    FlagFormat(TEX_FORMAT_RGBA16_FLOAT,               true,         F16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RGBA16_UNORM,               bTexNorm16,   U16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RGBA16_UINT,                true,         UI16BindFlags               );
    FlagFormat(TEX_FORMAT_RGBA16_SNORM,               bTexNorm16,   S16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RGBA16_SINT,                true,         SI16BindFlags               );
    FlagFormat(TEX_FORMAT_RG32_TYPELESS,              true                                      );
    FlagFormat(TEX_FORMAT_RG32_FLOAT,                 true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_RG32_SINT,                  true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_RG32_UINT,                  true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_R32G8X24_TYPELESS,          true                                      );
    FlagFormat(TEX_FORMAT_D32_FLOAT_S8X24_UINT,       true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS,   true,         TexBindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_X32_TYPELESS_G8X24_UINT,    false                                     );
    FlagFormat(TEX_FORMAT_RGB10A2_TYPELESS,           true                                      );
    FlagFormat(TEX_FORMAT_RGB10A2_UNORM,              true,         BindSrvRtvUav,          true);
    FlagFormat(TEX_FORMAT_RGB10A2_UINT,               true,         BindSrvRtvUav               );
    FlagFormat(TEX_FORMAT_R11G11B10_FLOAT,            true,         R11G11B10FBindFlags,    true);
    FlagFormat(TEX_FORMAT_RGBA8_TYPELESS,             true                                      );
    FlagFormat(TEX_FORMAT_RGBA8_UNORM,                true,         U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RGBA8_UNORM_SRGB,           true,         SRGBA8BindFlags,        true);
    FlagFormat(TEX_FORMAT_RGBA8_UINT,                 true,         UI8BindFlags                );
    FlagFormat(TEX_FORMAT_RGBA8_SNORM,                true,         S8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RGBA8_SINT,                 true,         SI8BindFlags                );
    FlagFormat(TEX_FORMAT_RG16_TYPELESS,              true                                      );
    FlagFormat(TEX_FORMAT_RG16_FLOAT,                 true,         F16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RG16_UNORM,                 bTexNorm16,   U16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RG16_UINT,                  true,         UI16BindFlags               );
    FlagFormat(TEX_FORMAT_RG16_SNORM,                 bTexNorm16,   S16BindFlags,           true);
    FlagFormat(TEX_FORMAT_RG16_SINT,                  true,         SI16BindFlags               );
    FlagFormat(TEX_FORMAT_R32_TYPELESS,               true                                      );
    FlagFormat(TEX_FORMAT_D32_FLOAT,                  true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R32_FLOAT,                  true,         F32BindFlags,     bDekstopGL);
    FlagFormat(TEX_FORMAT_R32_UINT,                   true,         UI32BindFlags               );
    FlagFormat(TEX_FORMAT_R32_SINT,                   true,         SI32BindFlags               );
    FlagFormat(TEX_FORMAT_R24G8_TYPELESS,             true                                      );
    FlagFormat(TEX_FORMAT_D24_UNORM_S8_UINT,          true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R24_UNORM_X8_TYPELESS,      true,         TexBindFlags,           true);
    FlagFormat(TEX_FORMAT_X24_TYPELESS_G8_UINT,       false                                     );
    FlagFormat(TEX_FORMAT_RG8_TYPELESS,               true                                      );
    FlagFormat(TEX_FORMAT_RG8_UNORM,                  true,         U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RG8_UINT,                   true,         UI8BindFlags                );
    FlagFormat(TEX_FORMAT_RG8_SNORM,                  true,         S8BindFlags,            true);
    FlagFormat(TEX_FORMAT_RG8_SINT,                   true,         SI8BindFlags                );
    FlagFormat(TEX_FORMAT_R16_TYPELESS,               true                                      );
    FlagFormat(TEX_FORMAT_R16_FLOAT,                  true,         F16BindFlags,           true);
    FlagFormat(TEX_FORMAT_D16_UNORM,                  true,         BIND_DEPTH_STENCIL          );
    FlagFormat(TEX_FORMAT_R16_UNORM,                  bTexNorm16,   U16BindFlags,           true);
    FlagFormat(TEX_FORMAT_R16_UINT,                   true,         UI16BindFlags               );
    FlagFormat(TEX_FORMAT_R16_SNORM,                  bTexNorm16,   S16BindFlags,           true);
    FlagFormat(TEX_FORMAT_R16_SINT,                   true,         SI16BindFlags               );
    FlagFormat(TEX_FORMAT_R8_TYPELESS,                true                                      );
    FlagFormat(TEX_FORMAT_R8_UNORM,                   true,         U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_R8_UINT,                    true,         UI8BindFlags                );
    FlagFormat(TEX_FORMAT_R8_SNORM,                   true,         S8BindFlags,            true);
    FlagFormat(TEX_FORMAT_R8_SINT,                    true,         SI8BindFlags                );
    FlagFormat(TEX_FORMAT_A8_UNORM,                   bTexSwizzle,  U8BindFlags,            true);
    FlagFormat(TEX_FORMAT_R1_UNORM,                   false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_RGB9E5_SHAREDEXP,           true,         BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_RG8_B8G8_UNORM,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_G8R8_G8B8_UNORM,            false                                     ); // Not supported in OpenGL

    FlagFormat(TEX_FORMAT_BC1_TYPELESS,               bS3TC                                     );
    FlagFormat(TEX_FORMAT_BC1_UNORM,                  bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC1_UNORM_SRGB,             bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC2_TYPELESS,               bS3TC                                     );
    FlagFormat(TEX_FORMAT_BC2_UNORM,                  bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC2_UNORM_SRGB,             bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC3_TYPELESS,               bS3TC                                     );
    FlagFormat(TEX_FORMAT_BC3_UNORM,                  bS3TC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC3_UNORM_SRGB,             bS3TC,        BIND_SHADER_RESOURCE,   true);

    FlagFormat(TEX_FORMAT_BC4_TYPELESS,               bRGTC                                     );
    FlagFormat(TEX_FORMAT_BC4_UNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC4_SNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC5_TYPELESS,               bRGTC                                     );
    FlagFormat(TEX_FORMAT_BC5_UNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC5_SNORM,                  bRGTC,        BIND_SHADER_RESOURCE,   true);

    FlagFormat(TEX_FORMAT_B5G6R5_UNORM,               false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_B5G5R5A1_UNORM,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRA8_UNORM,                bTexSwizzle,  BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BGRX8_UNORM,                false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM, false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRA8_TYPELESS,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRA8_UNORM_SRGB,           false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRX8_TYPELESS,             false                                     ); // Not supported in OpenGL
    FlagFormat(TEX_FORMAT_BGRX8_UNORM_SRGB,           false                                     ); // Not supported in OpenGL

    FlagFormat(TEX_FORMAT_BC6H_TYPELESS,              bBPTC);
    FlagFormat(TEX_FORMAT_BC6H_UF16,                  bBPTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC6H_SF16,                  bBPTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC7_TYPELESS,               bBPTC);
    FlagFormat(TEX_FORMAT_BC7_UNORM,                  bBPTC,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_BC7_UNORM_SRGB,             bBPTC,        BIND_SHADER_RESOURCE,   true);

    FlagFormat(TEX_FORMAT_ETC2_RGB8_UNORM,            bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGB8_UNORM_SRGB,       bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGB8A1_UNORM,          bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB,     bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGBA8_UNORM,           bETC2,        BIND_SHADER_RESOURCE,   true);
    FlagFormat(TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB,      bETC2,        BIND_SHADER_RESOURCE,   true);
    // clang-format on

#ifdef DILIGENT_DEVELOPMENT
    const bool bGL43OrAbove = DeviceInfo.Type == RENDER_DEVICE_TYPE_GL && DeviceInfo.APIVersion >= Version{4, 3};

    constexpr int      TestTextureDim = 8;
    constexpr int      MaxTexelSize   = 16;
    std::vector<Uint8> ZeroData(TestTextureDim * TestTextureDim * MaxTexelSize);

    // Go through all formats and try to create small 2D texture to check if the format is supported
    for (auto& FmtInfo : m_TextureFormatsInfo)
    {
        if (FmtInfo.Format == TEX_FORMAT_UNKNOWN)
            continue;

        auto GLFmt = TexFormatToGLInternalTexFormat(FmtInfo.Format);
        if (GLFmt == 0)
        {
            VERIFY(!FmtInfo.Supported, "Format should be marked as unsupported");
            continue;
        }

#    if GL_ARB_internalformat_query2
        // Only works on GL4.3+
        if (bGL43OrAbove)
        {
            GLint params = 0;
            glGetInternalformativ(GL_TEXTURE_2D, GLFmt, GL_INTERNALFORMAT_SUPPORTED, 1, &params);
            CHECK_GL_ERROR("glGetInternalformativ() failed");
            VERIFY(FmtInfo.Supported == (params == GL_TRUE), "This internal format should be supported");
        }
#    else
        (void)bGL43OrAbove; // To suppress warning
#    endif

        // Check that the format is indeed supported
        if (FmtInfo.Supported && !FmtInfo.IsDepthStencil() && !FmtInfo.IsTypeless)
        {
            GLObjectWrappers::GLTextureObj TestGLTex{true};
            // Immediate context has not been created yet, so use raw GL functions
            glBindTexture(GL_TEXTURE_2D, TestGLTex);
            CHECK_GL_ERROR("Failed to bind texture");
            glTexStorage2D(GL_TEXTURE_2D, 1, GLFmt, TestTextureDim, TestTextureDim);
            if (glGetError() == GL_NO_ERROR)
            {
                // It turned out it is not enough to only allocate texture storage
                // For some reason glTexStorage2D() may succeed, but upload operation
                // will later fail. So we need to additionally try to upload some
                // data to the texture
                const auto& TransferAttribs = GetNativePixelTransferAttribs(FmtInfo.Format);
                if (TransferAttribs.IsCompressed)
                {
                    const auto& FmtAttribs = GetTextureFormatAttribs(FmtInfo.Format);
                    static_assert((TestTextureDim & (TestTextureDim - 1)) == 0, "Test texture dim must be power of two!");
                    auto BlockBytesInRow = (TestTextureDim / int{FmtAttribs.BlockWidth}) * int{FmtAttribs.ComponentSize};
                    glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, // mip level
                                              0, 0, TestTextureDim, TestTextureDim,
                                              GLFmt,
                                              (TestTextureDim / int{FmtAttribs.BlockHeight}) * BlockBytesInRow,
                                              ZeroData.data());
                }
                else
                {
                    glTexSubImage2D(GL_TEXTURE_2D, 0, // mip level
                                    0, 0, TestTextureDim, TestTextureDim,
                                    TransferAttribs.PixelFormat, TransferAttribs.DataType,
                                    ZeroData.data());
                }

                if (glGetError() != GL_NO_ERROR)
                {
                    LOG_WARNING_MESSAGE("Failed to upload data to a test ", TestTextureDim, "x", TestTextureDim, " ", FmtInfo.Name,
                                        " texture. This likely indicates that the format is not supported despite being reported so by the device.");
                    FmtInfo.Supported = false;
                }
            }
            else
            {
                LOG_WARNING_MESSAGE("Failed to allocate storage for a test ", TestTextureDim, "x", TestTextureDim, " ", FmtInfo.Name,
                                    " texture. This likely indicates that the format is not supported despite being reported so by the device.");
                FmtInfo.Supported = false;
            }
            glBindTexture(GL_TEXTURE_2D, 0);
        }
    }
#endif
}